

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

void __thiscall DL::Data::Data(Data *this,string_t *key,DataGroup *grp)

{
  pointer pcVar1;
  
  (this->mKey)._M_dataplus._M_p = (pointer)&(this->mKey).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  this->mType = DT_Group;
  DataGroup::DataGroup(&this->mGroup,grp);
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Data::Data(const string_t& key, const DataGroup& grp)
	: mKey(key)
	, mType(DT_Group)
	, mGroup(grp)
{
}